

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

void duckdb::TemplatedGetSortKeyLength<duckdb::SortKeyBlobOperator>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyLengthInfo *result)

{
  data_ptr_t pdVar1;
  unsigned_long *puVar2;
  sel_t *psVar3;
  pointer puVar4;
  unsigned_long uVar5;
  idx_t iVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 auStack_3c [4];
  undefined1 *local_38;
  
  if (chunk.start < chunk.end) {
    pdVar1 = (vector_data->format).data;
    puVar2 = (vector_data->format).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
    ;
    psVar3 = ((vector_data->format).sel)->sel_vector;
    puVar4 = (result->variable_lengths).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar7 = chunk.start;
      if (psVar3 != (sel_t *)0x0) {
        uVar7 = (ulong)psVar3[chunk.start];
      }
      iVar6 = chunk.start;
      if (chunk.has_result_index != false) {
        iVar6 = chunk.result_index;
      }
      uVar5 = puVar4[iVar6];
      puVar4[iVar6] = uVar5 + 1;
      if ((puVar2 == (unsigned_long *)0x0) || ((puVar2[uVar7 >> 6] >> (uVar7 & 0x3f) & 1) != 0)) {
        uVar10 = *(ulong *)(pdVar1 + uVar7 * 0x10);
        local_38 = *(undefined1 **)(pdVar1 + uVar7 * 0x10 + 8);
        uVar8 = (uint)uVar10;
        if (uVar8 < 0xd) {
          local_38 = auStack_3c;
        }
        uVar10 = uVar10 & 0xffffffff;
        if (uVar8 == 0) {
          lVar9 = 0;
        }
        else {
          uVar7 = 0;
          lVar9 = 0;
          do {
            lVar9 = lVar9 + (ulong)((byte)local_38[uVar7] < 2);
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
        }
        puVar4[iVar6] = uVar5 + uVar10 + lVar9 + 2;
      }
      chunk.start = chunk.start + 1;
    } while (chunk.start != chunk.end);
  }
  return;
}

Assistant:

void TemplatedGetSortKeyLength(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyLengthInfo &result) {
	auto &format = vector_data.format;
	auto data = UnifiedVectorFormat::GetData<typename OP::TYPE>(vector_data.format);
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto idx = format.sel->get_index(r);
		auto result_index = chunk.GetResultIndex(r);
		result.variable_lengths[result_index]++; // every value is prefixed by a validity byte

		if (!format.validity.RowIsValid(idx)) {
			continue;
		}
		result.variable_lengths[result_index] += OP::GetEncodeLength(data[idx]);
	}
}